

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetAddressByHash160_Test::TestBody
          (ElementsAddressFactory_GetAddressByHash160_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  AddressType AVar4;
  char *lhs;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  Address *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 uVar5;
  NetType in_stack_fffffffffffffb8c;
  ElementsAddressFactory *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  AssertHelper local_450;
  Message local_448 [3];
  ByteData160 local_430 [16];
  byte local_299;
  ConstCharPtr local_298;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_280;
  AddressType local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  ByteData local_258;
  string local_240;
  AssertionResult local_220;
  allocator local_209;
  string local_208;
  ByteData160 local_1e8;
  Address local_1d0;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb80);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_209);
  cfd::core::ByteData160::ByteData160(&local_1e8,&local_208);
  cfd::AddressFactory::GetAddressByHash
            ((AddressFactory *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (AddressType)((ulong)in_stack_fffffffffffffb80 >> 0x20),
             (ByteData160 *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
  cfd::core::ByteData160::~ByteData160((ByteData160 *)0x1f49ec);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::Address::GetHash
            ((Address *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_240,&local_258);
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_220,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",lhs,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string((string *)&local_240);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f4a82);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_260);
    in_stack_fffffffffffffb90 =
         (ElementsAddressFactory *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1f4bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x97,(char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message((Message *)0x1f4c2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4c85);
  AVar4 = cfd::core::Address::GetAddressType(&local_1d0);
  local_280 = 2;
  local_27c = AVar4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffb98),(char *)in_stack_fffffffffffffb90,
             (AddressType *)CONCAT44(AVar4,in_stack_fffffffffffffb88),
             (AddressType *)in_stack_fffffffffffffb80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb88);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    in_stack_fffffffffffffb80 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x1f4d44);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x98,(char *)in_stack_fffffffffffffb80);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x1f4da1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4df9);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_298,"");
  uVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_298);
  if ((bool)uVar1) {
    local_299 = 0;
    uVar3 = testing::internal::AlwaysTrue();
    if ((bool)uVar3) {
      cfd::core::ByteData160::ByteData160(local_430);
      cfd::AddressFactory::GetAddressByHash
                ((AddressFactory *)CONCAT44(AVar4,uVar5),
                 (AddressType)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                 (ByteData160 *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffffb78)));
      cfd::core::Address::~Address(in_stack_fffffffffffffb80);
      cfd::core::ByteData160::~ByteData160((ByteData160 *)0x1f4e8d);
    }
    if ((local_299 & 1) != 0) goto LAB_001f4ff4;
    local_298.value =
         "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_448);
  testing::internal::AssertHelper::AssertHelper
            (&local_450,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x9a,local_298.value);
  testing::internal::AssertHelper::operator=(&local_450,local_448);
  testing::internal::AssertHelper::~AssertHelper(&local_450);
  testing::Message::~Message((Message *)0x1f4fb2);
LAB_001f4ff4:
  cfd::core::Address::~Address(in_stack_fffffffffffffb80);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f500e);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetAddressByHash160)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData160("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()), CfdException);
  }
}